

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O1

void mp::WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,std::array<int,3ul>,int>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,array<int,_3UL> *v,
               ItemNamer *vnam)

{
  Buffer<char> *pBVar1;
  size_t sVar2;
  char *pcVar3;
  size_t __n;
  ptrdiff_t _Num;
  char *str;
  ulong uVar4;
  long lVar5;
  array<int,_3UL> *__range2;
  
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  if (pBVar1->size_ == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,pBVar1->size_ + 1);
  }
  sVar2 = pBVar1->size_;
  pBVar1->size_ = sVar2 + 1;
  pBVar1->ptr_[sVar2] = '[';
  lVar5 = 0;
  do {
    if ((int)lVar5 != 0) {
      pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
      uVar4 = pBVar1->size_ + 2;
      if (pBVar1->capacity_ < uVar4) {
        (**pBVar1->_vptr_Buffer)(pBVar1,uVar4);
      }
      pcVar3 = pBVar1->ptr_;
      sVar2 = pBVar1->size_;
      (pcVar3 + sVar2)[0] = ',';
      (pcVar3 + sVar2)[1] = ' ';
      pBVar1->size_ = uVar4;
    }
    pcVar3 = ItemNamer::at(vnam,(long)*(int *)((long)v->_M_elems + lVar5));
    __n = strlen(pcVar3);
    pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
    uVar4 = pBVar1->size_ + __n;
    if (pBVar1->capacity_ < uVar4) {
      (**pBVar1->_vptr_Buffer)(pBVar1,uVar4);
    }
    if (__n != 0) {
      memmove(pBVar1->ptr_ + pBVar1->size_,pcVar3,__n);
    }
    pBVar1->size_ = uVar4;
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0xc);
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  if (pBVar1->size_ == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,pBVar1->size_ + 1);
  }
  sVar2 = pBVar1->size_;
  pBVar1->size_ = sVar2 + 1;
  pBVar1->ptr_[sVar2] = ']';
  return;
}

Assistant:

inline void WriteModelItem(
    Writer& wrt, const Vec& v,
    ItemNamer& vnam) {
  static_assert (
  std::is_integral_v<typename Vec::value_type>, "Variable vector: need int's");
  wrt << '[';
  int n=-1;
  for (const auto& el: v) {
    if (++n)
      wrt << ", ";
    wrt << vnam.at(el);
  }
  wrt << ']';
}